

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize<char>(FSerializer *arc,char *key,char **pstr,char **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  char cVar4;
  int iVar5;
  Value *this;
  Ch *cc;
  char *pcVar6;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (((byte)(uVar1 >> 10) & 1) == 0 && uVar1 != 0) {
        __assert_fail("val->IsNull() || val->IsString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x86f,"FSerializer &Serialize(FSerializer &, const char *, char *&, char **)"
                     );
      }
      if (uVar1 == 0) {
        *pstr = (char *)0x0;
      }
      else if ((uVar1 >> 10 & 1) == 0) {
        Printf("\x1cGstring expected for \'%s\'",key);
        *pstr = (char *)0x0;
        arc->mErrors = arc->mErrors + 1;
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        pcVar6 = UnicodeToString(cc);
        pcVar6 = copystring(pcVar6);
        *pstr = pcVar6;
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if (uVar2 == 0) {
      cVar4 = '\0';
    }
    else {
      cVar4 = (pFVar3->mInObject).Array[uVar2 - 1];
    }
    if (((def != (char **)0x0) && (cVar4 != '\0')) && (iVar5 = strcmp(*pstr,*def), iVar5 == 0)) {
      return arc;
    }
    FSerializer::WriteKey(arc,key);
    if (*pstr == (char *)0x0) {
      FWriter::Null(arc->w);
    }
    else {
      FWriter::String(arc->w,*pstr);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, char *&pstr, char **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || strcmp(pstr, *def))
		{
			arc.WriteKey(key);
			if (pstr == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(pstr);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = nullptr;
			}
			else if (val->IsString())
			{
				pstr = copystring(UnicodeToString(val->GetString()));
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;
}